

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void ptrobj_rewind(t_ptrobj *x)

{
  t_gstub *ptVar1;
  int iVar2;
  char *fmt;
  
  iVar2 = gpointer_check(&x->x_gp,1);
  if (iVar2 == 0) {
    fmt = "pointer rewind: empty pointer";
  }
  else {
    ptVar1 = (x->x_gp).gp_stub;
    if (ptVar1->gs_which == 1) {
      gpointer_setglist(&x->x_gp,(ptVar1->gs_un).gs_glist,(t_scalar *)0x0);
      ptrobj_bang(x);
      return;
    }
    fmt = "pointer rewind: sorry, unavailable for arrays";
  }
  pd_error(x,fmt);
  return;
}

Assistant:

static void ptrobj_rewind(t_ptrobj *x)
{
    t_scalar *sc;
    t_symbol *templatesym;
    int n;
    t_typedout *to;
    t_glist *glist;
    t_pd *canvas;
    t_gstub *gs;
    if (!gpointer_check(&x->x_gp, 1))
    {
        pd_error(x, "pointer rewind: empty pointer");
        return;
    }
    gs = x->x_gp.gp_stub;
    if (gs->gs_which != GP_GLIST)
    {
        pd_error(x, "pointer rewind: sorry, unavailable for arrays");
        return;
    }
    glist = gs->gs_un.gs_glist;
    gpointer_setglist(&x->x_gp, glist, 0);
    ptrobj_bang(x);
}